

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall pugi::xml_node::insert_move_after(xml_node *this,xml_node *moved,xml_node *node)

{
  xml_node_struct *pxVar1;
  bool bVar2;
  xml_node local_20;
  
  bVar2 = impl::anon_unknown_0::allow_move(this,moved);
  if ((((bVar2) && (pxVar1 = node->_root, pxVar1 != (xml_node_struct *)0x0)) &&
      (pxVar1->parent == this->_root)) && (moved->_root != pxVar1)) {
    impl::anon_unknown_0::remove_node(moved->_root);
    impl::anon_unknown_0::insert_node_after(moved->_root,node->_root);
    local_20 = (xml_node)moved->_root;
  }
  else {
    xml_node(&local_20);
  }
  return (xml_node)local_20._root;
}

Assistant:

PUGI__FN xml_node xml_node::insert_move_after(const xml_node& moved, const xml_node& node)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();
		if (moved._root == node._root) return xml_node();

		impl::remove_node(moved._root);
		impl::insert_node_after(moved._root, node._root);

		return moved;
	}